

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

uint32_t decCheckMath(decNumber *rhs,decContext *set,uint32_t *status)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = *status;
  uVar3 = 0x40;
  if (((set->digits < 1000000) && (uVar3 = 0x40, set->emax < 1000000)) && (-1000000 < set->emin)) {
    iVar2 = rhs->digits;
    uVar3 = 0x80;
    if ((iVar2 < 1000000) &&
       ((uVar4 = uVar1, 0xffd23942 < (iVar2 + rhs->exponent) - 0xf4241U ||
        (((iVar2 == 1 && (rhs->lsu[0] == '\0')) && ((rhs->bits & 0x70) == 0)))))) goto LAB_00245954;
  }
  *status = uVar3 | uVar1;
  uVar4 = uVar3 | uVar1;
LAB_00245954:
  return (uint)(uVar4 != uVar1);
}

Assistant:

static uInt decCheckMath(const decNumber *rhs, decContext *set,
                         uInt *status) {
  uInt save=*status;                         /* record  */
  if (set->digits>DEC_MAX_MATH
   || set->emax>DEC_MAX_MATH
   || -set->emin>DEC_MAX_MATH) *status|=DEC_Invalid_context;
   else if ((rhs->digits>DEC_MAX_MATH
     || rhs->exponent+rhs->digits>DEC_MAX_MATH+1
     || rhs->exponent+rhs->digits<2*(1-DEC_MAX_MATH))
     && !ISZERO(rhs)) *status|=DEC_Invalid_operation;
  return (*status!=save);
  }